

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_int.c
# Opt level: O0

int mpt_culong(unsigned_long *val,char *src,int base,unsigned_long *range)

{
  ulong uStack_38;
  int ret;
  unsigned_long tmp;
  unsigned_long *range_local;
  char *pcStack_20;
  int base_local;
  char *src_local;
  unsigned_long *val_local;
  
  tmp = (unsigned_long)range;
  range_local._4_4_ = base;
  pcStack_20 = src;
  src_local = (char *)val;
  val_local._4_4_ = _mpt_convert_uint(&stack0xffffffffffffffc8,8,src,base);
  if (0 < val_local._4_4_) {
    if ((tmp == 0) || ((*(ulong *)tmp <= uStack_38 && (uStack_38 <= *(ulong *)(tmp + 8))))) {
      if (src_local != (char *)0x0) {
        *(ulong *)src_local = uStack_38;
      }
    }
    else {
      val_local._4_4_ = -2;
    }
  }
  return val_local._4_4_;
}

Assistant:

extern int _mpt_convert_uint(void *val, size_t vlen, const char *src, int base)
{
	uintmax_t tmp;
	char *end;
	
	if (!(end = (char *) src)) {
		return MPT_ERROR(BadArgument);
	}
	if (!*src) {
		return 0;
	}
	/* max size unsigend integer */
	tmp = strtoumax(src, &end, base);
	if (end == src) {
		/* accept space as empty string */
		while (*src) {
			if (!isspace(*src++)) {
				return MPT_ERROR(BadType);
			}
		}
		return 0;
	}
	switch (vlen) {
	  case sizeof(int8_t) :
		if (tmp > UINT8_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int8_t *) val) = tmp;
		break;
	  case sizeof(int16_t):
		if (tmp > UINT16_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int16_t *) val) = tmp;
		break;
	  case sizeof(int32_t):
		if (tmp > UINT32_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int32_t *) val) = tmp;
		break;
	  case sizeof(int64_t):
		if (tmp > UINT64_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int64_t *) val) = tmp;
		break;
	  default:
		return MPT_ERROR(BadType);
	}
	return end - src;
}